

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processExecRequest(CommonCore *this,ActionMessage *cmd)

{
  string_view message;
  bool bVar1;
  int iVar2;
  __int_type_conflict _Var3;
  pointer pBVar4;
  long in_RSI;
  CommonCore *in_RDI;
  ActionMessage *in_stack_00000020;
  CommonCore *in_stack_00000028;
  GlobalFederateId in_stack_00000034;
  GlobalFederateId *dep;
  iterator __end3;
  iterator __begin3;
  bool in_stack_0000007b;
  int in_stack_0000007c;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range3;
  undefined1 in_stack_00000088 [16];
  GlobalFederateId in_stack_0000009c;
  MessageProcessingResult res;
  ActionMessage *in_stack_000001b8;
  CommonCore *in_stack_000001c0;
  char *in_stack_000001c8;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
  *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  CommonCore *in_stack_ffffffffffffff38;
  GlobalFederateId in_stack_ffffffffffffff40;
  GlobalFederateId in_stack_ffffffffffffff54;
  key_type *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  in_stack_ffffffffffffff78;
  undefined1 local_80 [24];
  undefined1 *local_68;
  BaseType local_5c;
  __sv_type local_48;
  BaseType local_34;
  GlobalFederateId local_30;
  GlobalFederateId local_2c;
  char local_25;
  BaseType local_24;
  BaseType local_20;
  undefined4 local_1c;
  BaseType local_18;
  GlobalFederateId local_14;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = (BaseType)
             GlobalFederateId::operator_cast_to_GlobalBrokerId
                       ((GlobalFederateId *)in_stack_ffffffffffffff18);
  GlobalFederateId::GlobalFederateId(&local_14,(GlobalBrokerId)local_18);
  bVar1 = isLocal(in_RDI,in_stack_ffffffffffffff54);
  if (bVar1) {
    local_1c = *(undefined4 *)(local_10 + 8);
    bVar1 = hasTimeBlock(in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
    if (bVar1) {
      local_20 = GlobalFederateId::baseValue((GlobalFederateId *)(local_10 + 8));
      std::
      map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
      ::operator[]((map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      return;
    }
  }
  local_24 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
  bVar1 = GlobalFederateId::operator==
                    ((GlobalFederateId *)(local_10 + 0x10),(GlobalBrokerId)local_24);
  if (bVar1) {
    pBVar4 = CLI::std::
             unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                           *)0x53e9b6);
    (*pBVar4->_vptr_BaseTimeCoordinator[3])();
    if (((in_RDI->super_BrokerBase).enteredExecutionMode & 1U) == 0) {
      pBVar4 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x53e9ee);
      memset(&local_2c,0,4);
      GlobalFederateId::GlobalFederateId(&local_2c);
      iVar2 = (*pBVar4->_vptr_BaseTimeCoordinator[9])(pBVar4,(ulong)(uint)local_2c.gid);
      local_25 = (char)iVar2;
      if (local_25 == '\0') {
        (in_RDI->super_BrokerBase).enteredExecutionMode = true;
        _Var3 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_ffffffffffffff28);
        if (0xe < _Var3) {
          this_00 = (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI->super_BrokerBase;
          local_34 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_30,(GlobalBrokerId)local_34);
          getIdentifier_abi_cxx11_(in_RDI);
          local_48 = std::__cxx11::string::operator_cast_to_basic_string_view
                               (in_stack_ffffffffffffff20);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (this_00,(char *)in_stack_ffffffffffffff28);
          message._M_str = in_stack_000001c8;
          message._M_len = (size_t)in_stack_000001c0;
          BrokerBase::sendToLogger
                    ((BrokerBase *)__range3,in_stack_0000009c,in_stack_0000007c,
                     (string_view)in_stack_00000088,message,in_stack_0000007b);
        }
      }
      else {
        pBVar4 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x53eb1a);
        (*pBVar4->_vptr_BaseTimeCoordinator[2])();
      }
    }
  }
  else {
    bVar1 = GlobalFederateId::isValid((GlobalFederateId *)(local_10 + 0x10));
    if (!bVar1) {
      local_5c = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      bVar1 = GlobalFederateId::operator==
                        ((GlobalFederateId *)(local_10 + 8),(GlobalBrokerId)local_5c);
      if (bVar1) {
        CLI::std::
        unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
        operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                    *)0x53eb88);
        BaseTimeCoordinator::getDependents
                  ((BaseTimeCoordinator *)in_stack_ffffffffffffff78._M_current);
        local_68 = local_80;
        std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::begin
                  (in_stack_ffffffffffffff18);
        std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::end
                  (in_stack_ffffffffffffff18);
        while (bVar1 = __gnu_cxx::
                       operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                 ((__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                   *)in_stack_ffffffffffffff20,
                                  (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                   *)in_stack_ffffffffffffff18), ((bVar1 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
          ::operator*((__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                       *)&stack0xffffffffffffff78);
          routeMessage(in_stack_00000028,in_stack_00000020,in_stack_00000034);
          __gnu_cxx::
          __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
          ::operator++((__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                        *)&stack0xffffffffffffff78);
        }
        std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
                  ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                   in_stack_ffffffffffffff30);
        return;
      }
    }
    routeMessage(in_stack_000001c0,in_stack_000001b8);
  }
  return;
}

Assistant:

void CommonCore::processExecRequest(ActionMessage& cmd)
{
    if (isLocal(GlobalBrokerId{cmd.source_id})) {
        if (hasTimeBlock(cmd.source_id)) {
            delayedTimingMessages[cmd.source_id.baseValue()].push_back(cmd);
            return;
        }
    }
    if (cmd.dest_id == global_broker_id_local) {
        timeCoord->processTimeMessage(cmd);
        if (!enteredExecutionMode) {
            auto res = timeCoord->checkExecEntry();
            if (res == MessageProcessingResult::NEXT_STEP) {
                enteredExecutionMode = true;
                LOG_TIMING(global_broker_id_local, getIdentifier(), "entering Exec Mode");
            } else {
                timeCoord->updateTimeFactors();
            }
        }
    } else if (!cmd.dest_id.isValid() && cmd.source_id == global_broker_id_local) {
        for (auto& dep : timeCoord->getDependents()) {
            routeMessage(cmd, dep);
        }
    } else {
        routeMessage(cmd);
    }
}